

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_divs_16_al(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  sint remainder;
  sint quotient;
  sint src;
  uint *r_dst;
  
  puVar4 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = OPER_AL_16();
  iVar2 = (int)(short)uVar1;
  if (iVar2 == 0) {
    m68ki_exception_trap(5);
  }
  else if ((*puVar4 == 0x80000000) && (iVar2 == -1)) {
    m68ki_cpu.not_z_flag = 0;
    m68ki_cpu.n_flag = 0;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    *puVar4 = 0;
  }
  else {
    uVar3 = (int)*puVar4 / iVar2;
    if (uVar3 == (int)(short)uVar3) {
      m68ki_cpu.n_flag = (int)uVar3 >> 8;
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.c_flag = 0;
      m68ki_cpu.not_z_flag = uVar3;
      *puVar4 = uVar3 & 0xffff | (int)*puVar4 % iVar2 << 0x10;
    }
    else {
      m68ki_cpu.v_flag = 0x80;
    }
  }
  return;
}

Assistant:

static void m68k_op_divs_16_al(void)
{
	uint* r_dst = &DX;
	sint src = MAKE_INT_16(OPER_AL_16());
	sint quotient;
	sint remainder;

	if(src != 0)
	{
		if((uint32)*r_dst == 0x80000000 && src == -1)
		{
			FLAG_Z = 0;
			FLAG_N = NFLAG_CLEAR;
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = 0;
			return;
		}

		quotient = MAKE_INT_32(*r_dst) / src;
		remainder = MAKE_INT_32(*r_dst) % src;

		if(quotient == MAKE_INT_16(quotient))
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}